

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O2

void slang::iterDirectoriesRecursive
               (path *path,SmallVector<std::filesystem::__cxx11::path,_2UL> *results,
               flat_hash_set<std::string> *visited)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer pbVar3;
  ulong uVar4;
  int iVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  byte bVar9;
  __type_conflict3 _Var10;
  uint uVar11;
  pointer ppVar12;
  uint64_t hash;
  ulong pos0;
  path *__rhs;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  byte bVar16;
  pointer ppVar17;
  undefined1 auVar18 [16];
  error_code ec;
  locator local_d8;
  SmallVector<std::filesystem::__cxx11::path,_2UL> local;
  path canonical;
  
  local.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
       (pointer)local.super_SmallVectorBase<std::filesystem::__cxx11::path>.firstElement;
  local.super_SmallVectorBase<std::filesystem::__cxx11::path>.len = 0;
  local.super_SmallVectorBase<std::filesystem::__cxx11::path>.cap = 2;
  iterDirectory(path,&local,Directories);
  __rhs = (path *)(local.super_SmallVectorBase<std::filesystem::__cxx11::path>.len +
                  (results->super_SmallVectorBase<std::filesystem::__cxx11::path>).len);
  SmallVectorBase<std::filesystem::__cxx11::path>::reserve
            (&results->super_SmallVectorBase<std::filesystem::__cxx11::path>,(size_type)__rhs);
  ppVar12 = local.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ +
            local.super_SmallVectorBase<std::filesystem::__cxx11::path>.len;
  ppVar17 = local.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_;
  do {
    if (ppVar17 == ppVar12) {
      SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
                (&local.super_SmallVectorBase<std::filesystem::__cxx11::path>,(EVP_PKEY_CTX *)__rhs)
      ;
      return;
    }
    std::_V2::system_category();
    std::filesystem::weakly_canonical(&canonical,(error_code *)ppVar17);
    hash = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                         *)visited,&canonical._M_pathname);
    pos0 = hash >> ((byte)(visited->table_).
                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
                          .arrays.groups_size_index & 0x3f);
    lVar13 = (hash & 0xff) * 4;
    uVar6 = (&UNK_0043a38c)[lVar13];
    uVar7 = (&UNK_0043a38d)[lVar13];
    uVar8 = (&UNK_0043a38e)[lVar13];
    bVar9 = (&UNK_0043a38f)[lVar13];
    uVar15 = 0;
    uVar14 = pos0;
    do {
      pgVar2 = (visited->table_).
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
               .arrays.groups_;
      pgVar1 = pgVar2 + uVar14;
      bVar16 = pgVar1->m[0xf].n;
      auVar18[0] = -(pgVar1->m[0].n == uVar6);
      auVar18[1] = -(pgVar1->m[1].n == uVar7);
      auVar18[2] = -(pgVar1->m[2].n == uVar8);
      auVar18[3] = -(pgVar1->m[3].n == bVar9);
      auVar18[4] = -(pgVar1->m[4].n == uVar6);
      auVar18[5] = -(pgVar1->m[5].n == uVar7);
      auVar18[6] = -(pgVar1->m[6].n == uVar8);
      auVar18[7] = -(pgVar1->m[7].n == bVar9);
      auVar18[8] = -(pgVar1->m[8].n == uVar6);
      auVar18[9] = -(pgVar1->m[9].n == uVar7);
      auVar18[10] = -(pgVar1->m[10].n == uVar8);
      auVar18[0xb] = -(pgVar1->m[0xb].n == bVar9);
      auVar18[0xc] = -(pgVar1->m[0xc].n == uVar6);
      auVar18[0xd] = -(pgVar1->m[0xd].n == uVar7);
      auVar18[0xe] = -(pgVar1->m[0xe].n == uVar8);
      auVar18[0xf] = -(bVar16 == bVar9);
      uVar11 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
      if (uVar11 != 0) {
        pbVar3 = (visited->table_).
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
                 .arrays.elements_;
        do {
          iVar5 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
            }
          }
          __rhs = (path *)((long)&pbVar3[uVar14 * 0xf]._M_dataplus._M_p + (ulong)(uint)(iVar5 << 5))
          ;
          _Var10 = std::operator==(&canonical._M_pathname,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__rhs);
          if (_Var10) goto LAB_00203774;
          uVar11 = uVar11 - 1 & uVar11;
        } while (uVar11 != 0);
        bVar16 = pgVar2[uVar14].m[0xf].n;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar16) == 0) break;
      uVar4 = (visited->table_).
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
              .arrays.groups_size_mask;
      lVar13 = uVar14 + uVar15;
      uVar15 = uVar15 + 1;
      uVar14 = lVar13 + 1U & uVar4;
    } while (uVar15 <= uVar4);
    if ((visited->table_).
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
        .size_ctrl.size <
        (visited->table_).
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::unchecked_emplace_at<std::__cxx11::string_const&>
                (&local_d8,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)visited,pos0,hash,&canonical._M_pathname);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::unchecked_emplace_with_rehash<std::__cxx11::string_const&>
                (&local_d8,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)visited,hash,&canonical._M_pathname);
    }
    iterDirectoriesRecursive(&canonical,results,visited);
    __rhs = &canonical;
    SmallVectorBase<std::filesystem::__cxx11::path>::emplace_back<std::filesystem::__cxx11::path>
              (&results->super_SmallVectorBase<std::filesystem::__cxx11::path>,&canonical);
LAB_00203774:
    std::filesystem::__cxx11::path::~path(&canonical);
    ppVar17 = ppVar17 + 1;
  } while( true );
}

Assistant:

static void iterDirectoriesRecursive(const fs::path& path, SmallVector<fs::path>& results,
                                     flat_hash_set<std::string>& visited) {
    SmallVector<fs::path> local;
    iterDirectory(path, local, GlobMode::Directories);

    results.reserve(results.size() + local.size());
    for (auto& p : local) {
        // Avoid recursing into directories we've already visited (via symlinks).
        std::error_code ec;
        fs::path canonical = fs::weakly_canonical(p, ec);

        if (!ec && visited.emplace(getU8Str(canonical)).second) {
            iterDirectoriesRecursive(canonical, results, visited);
            results.emplace_back(std::move(canonical));
        }
    }
}